

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O2

void __thiscall
avro::MapParser::MapParser
          (MapParser *this,ResolverFactory *factory,NodePtr *writer,NodePtr *reader,
          CompoundLayout *offsets)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  const_reference pTVar3;
  Resolver *p;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_parse_001ef2b8;
  iVar1 = (*writer->px->_vptr_Node[5])(writer->px,1);
  iVar2 = (*reader->px->_vptr_Node[5])(reader->px,1);
  pTVar3 = boost::
           ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
           ::at((ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
                 *)(offsets + 0x10),1);
  p = ResolverFactory::construct
                (factory,(NodePtr *)CONCAT44(extraout_var,iVar1),
                 (NodePtr *)CONCAT44(extraout_var_00,iVar2),pTVar3);
  boost::shared_ptr<avro::Resolver>::shared_ptr<avro::Resolver>(&this->resolver_,p);
  this->offset_ = *(size_t *)(offsets + 8);
  pTVar3 = boost::
           ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
           ::at((ptr_sequence_adapter<avro::Layout,_std::vector<void_*,_std::allocator<void_*>_>,_boost::heap_clone_allocator>
                 *)(offsets + 0x10),0);
  this->setFuncOffset_ = *(size_t *)(pTVar3 + 8);
  return;
}

Assistant:

MapParser::MapParser(ResolverFactory &factory, const NodePtr &writer, const NodePtr &reader, const CompoundLayout &offsets) :
    Resolver(),
    resolver_(factory.construct(writer->leafAt(1), reader->leafAt(1), offsets.at(1))),
    offset_(offsets.offset()),
    setFuncOffset_( offsets.at(0).offset())
{ }